

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3SyncMethod(sqlite3_vtab *pVtab)

{
  sqlite3_stmt *pStmt_00;
  int iVar1;
  sqlite3_stmt *in_RAX;
  Mem *pMem;
  i64 iVar2;
  int iVar3;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_28;
  
  local_28 = in_RAX;
  iVar1 = sqlite3Fts3PendingTermsFlush((Fts3Table *)pVtab);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (((4 < *(uint *)((long)&pVtab[4].pModule + 4)) && (*(int *)&pVtab[4].pModule != 0)) &&
       (iVar1 = 0, *(int *)&pVtab[4].pModule != 0xff)) {
      local_28 = (sqlite3_stmt *)0x0;
      iVar3 = 0;
      iVar1 = fts3SqlStmt((Fts3Table *)pVtab,0x24,&local_28,(sqlite3_value **)0x0);
      pStmt_00 = local_28;
      if (iVar1 == 0) {
        iVar1 = sqlite3_step(local_28);
        iVar3 = 0;
        if (iVar1 == 100) {
          pMem = columnMem(pStmt_00,0);
          iVar2 = sqlite3VdbeIntValue(pMem);
          iVar3 = (int)iVar2;
          columnMallocFailure(pStmt_00);
        }
        iVar1 = sqlite3_reset(pStmt_00);
      }
      iVar3 = iVar3 * *(int *)((long)&pVtab[4].pModule + 4);
      iVar3 = iVar3 / 2 + iVar3;
      if (0x40 < iVar3) {
        iVar1 = sqlite3Fts3Incrmerge((Fts3Table *)pVtab,iVar3,*(int *)&pVtab[4].pModule);
      }
    }
  }
  sqlite3_blob_close(*(sqlite3_blob **)&pVtab[0x13].nRef);
  *(undefined8 *)&pVtab[0x13].nRef = 0;
  return iVar1;
}

Assistant:

static int fts3SyncMethod(sqlite3_vtab *pVtab){

  /* Following an incremental-merge operation, assuming that the input
  ** segments are not completely consumed (the usual case), they are updated
  ** in place to remove the entries that have already been merged. This
  ** involves updating the leaf block that contains the smallest unmerged
  ** entry and each block (if any) between the leaf and the root node. So
  ** if the height of the input segment b-trees is N, and input segments
  ** are merged eight at a time, updating the input segments at the end
  ** of an incremental-merge requires writing (8*(1+N)) blocks. N is usually
  ** small - often between 0 and 2. So the overhead of the incremental
  ** merge is somewhere between 8 and 24 blocks. To avoid this overhead
  ** dwarfing the actual productive work accomplished, the incremental merge
  ** is only attempted if it will write at least 64 leaf blocks. Hence
  ** nMinMerge.
  **
  ** Of course, updating the input segments also involves deleting a bunch
  ** of blocks from the segments table. But this is not considered overhead
  ** as it would also be required by a crisis-merge that used the same input 
  ** segments.
  */
  const u32 nMinMerge = 64;       /* Minimum amount of incr-merge work to do */

  Fts3Table *p = (Fts3Table*)pVtab;
  int rc = sqlite3Fts3PendingTermsFlush(p);

  if( rc==SQLITE_OK 
   && p->nLeafAdd>(nMinMerge/16) 
   && p->nAutoincrmerge && p->nAutoincrmerge!=0xff
  ){
    int mxLevel = 0;              /* Maximum relative level value in db */
    int A;                        /* Incr-merge parameter A */

    rc = sqlite3Fts3MaxLevel(p, &mxLevel);
    assert( rc==SQLITE_OK || mxLevel==0 );
    A = p->nLeafAdd * mxLevel;
    A += (A/2);
    if( A>(int)nMinMerge ) rc = sqlite3Fts3Incrmerge(p, A, p->nAutoincrmerge);
  }
  sqlite3Fts3SegmentsClose(p);
  return rc;
}